

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O1

void Js::SimpleJitHelpers::RecordLoopImplicitCallFlags
               (void *framePtr,uint loopNum,int restoreCallFlags)

{
  ImplicitCallFlags flags;
  ThreadContext *pTVar1;
  JavascriptCallStackLayout *pJVar2;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  ScriptContext *pSVar3;
  
  pJVar2 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar2);
  this_00 = FunctionBody::GetDynamicProfileInfo(this);
  pSVar3 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  pTVar1 = pSVar3->threadContext;
  flags = pTVar1->implicitCallFlags;
  DynamicProfileInfo::RecordLoopImplicitCallFlags(this_00,this,loopNum,flags);
  pTVar1->implicitCallFlags = (ImplicitCallFlags)restoreCallFlags | flags;
  return;
}

Assistant:

void SimpleJitHelpers::RecordLoopImplicitCallFlags(void* framePtr, uint loopNum, int restoreCallFlags)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleRecordLoopImplicitCallFlags);
        auto layout = JavascriptCallStackLayout::FromFramePointer(framePtr);
        FunctionBody* functionBody = layout->functionObject->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        ThreadContext * threadContext = functionBody->GetScriptContext()->GetThreadContext();
        auto flags = threadContext->GetAddressOfImplicitCallFlags();

        const auto fls = *flags;
        dynamicProfileInfo->RecordLoopImplicitCallFlags(functionBody, loopNum, fls);

        // Due to how JITed code is lowered, even we requested the Opnd to be the size of ImplicitCallArgs, the full
        //     register is pushed, with whatever junk is in the upper bits. So mask them off.
        restoreCallFlags = restoreCallFlags & ((1 << sizeof(ImplicitCallFlags)*8) - 1);

        // If the caller doesn't want to add in any call flags they will pass zero in restoreCallFlags.
        //    and since ORing with 0 is idempotent, we can just OR it either way
        *flags = (ImplicitCallFlags)(restoreCallFlags | fls);
        JIT_HELPER_END(SimpleRecordLoopImplicitCallFlags);
    }